

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O2

mat<4UL,_4UL> * __thiscall
mat<4UL,_4UL>::invert_transpose(mat<4UL,_4UL> *__return_storage_ptr__,mat<4UL,_4UL> *this)

{
  mat<4UL,_4UL> ret;
  double local_a0;
  mat<4UL,_4UL> local_98;
  
  adjugate(&local_98,this);
  local_a0 = dot<4ul,double>(local_98.rows,this->rows);
  operator/(__return_storage_ptr__,&local_98,&local_a0);
  return __return_storage_ptr__;
}

Assistant:

mat<nrows, ncols> invert_transpose() const
    {
        mat<nrows, ncols> ret = adjugate();
        return ret / dot(ret[0], rows[0]);
    }